

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O1

void update_z(OSQPWorkspace *work)

{
  double dVar1;
  long lVar2;
  OSQPSettings *pOVar3;
  long lVar4;
  c_float *pcVar5;
  c_float *pcVar6;
  c_float *pcVar7;
  c_float *pcVar8;
  c_float *pcVar9;
  long lVar10;
  
  lVar2 = work->data->m;
  if (0 < lVar2) {
    pOVar3 = work->settings;
    lVar4 = work->data->n;
    pcVar5 = work->xz_tilde;
    pcVar6 = work->z_prev;
    pcVar7 = work->rho_inv_vec;
    pcVar8 = work->y;
    pcVar9 = work->z;
    lVar10 = 0;
    do {
      dVar1 = pOVar3->alpha;
      pcVar9[lVar10] =
           pcVar7[lVar10] * pcVar8[lVar10] +
           dVar1 * pcVar5[lVar4 + lVar10] + (1.0 - dVar1) * pcVar6[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar2 != lVar10);
  }
  project(work,work->z);
  return;
}

Assistant:

void update_z(OSQPWorkspace *work) {
  c_int i;

  // update z
  for (i = 0; i < work->data->m; i++) {
    work->z[i] = work->settings->alpha * work->xz_tilde[i + work->data->n] +
                 ((c_float)1.0 - work->settings->alpha) * work->z_prev[i] +
                 work->rho_inv_vec[i] * work->y[i];
  }

  // project z
  project(work, work->z);
}